

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

RecyclerWeakReference<const_Js::PropertyRecord> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::UncheckedInsert(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                  *this,RecyclerWeakReference<const_Js::PropertyRecord> *weakRef,
                 PropertyGuardEntry *value)

{
  hash_t key;
  hash_t key_00;
  Type pcVar1;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar2;
  Type pcVar3;
  code *pcVar4;
  uint uVar5;
  hash_t bucket;
  hash_t bucket_00;
  uint i;
  undefined4 *puVar6;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar7;
  uint previous;
  hash_t hVar8;
  byte bVar9;
  bool bVar10;
  
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key = *(int *)((weakRef->super_RecyclerWeakReferenceBase).strongRef + 0xc) * 2 + 1;
  bucket = PrimePolicy::ModPrime(key,this->size,this->modFunctionIndex);
  bucket_00 = 0xffffffff;
  if ((this->buckets).ptr != (int *)0x0) {
    pcVar1 = (weakRef->super_RecyclerWeakReferenceBase).strongRef;
    key_00 = *(int *)(pcVar1 + 0xc) * 2 + 1;
    bucket_00 = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
    if ((this->buckets).ptr != (int *)0x0) {
      Memory::Recycler::IsSweeping(this->recycler);
      i = (this->buckets).ptr[bucket_00];
      if ((int)i < 0) {
        bVar10 = true;
      }
      else {
        previous = 0xffffffff;
        hVar8 = bucket_00;
        do {
          pWVar2 = (this->entries).ptr;
          if (pWVar2[i].hash == key_00) {
            pcVar3 = ((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
            if (pcVar3 == (Type)0x0) {
              i = RemoveEntry(this,i,previous,bucket_00);
              bVar9 = 3;
            }
            else {
              bVar9 = *(int *)(pcVar3 + 8) == *(int *)(pcVar1 + 8);
              if ((bool)bVar9) {
                hVar8 = i;
              }
            }
            if (bVar9 == 0) goto LAB_007cdcc2;
            uVar5 = i;
            if (bVar9 != 3) goto LAB_007cdcdd;
          }
          else {
LAB_007cdcc2:
            uVar5 = (this->entries).ptr[(int)i].next;
            previous = i;
          }
          i = uVar5;
        } while (-1 < (int)i);
        bVar9 = 0;
LAB_007cdcdd:
        bucket_00 = hVar8;
        bVar10 = (bVar9 & 1) == 0;
      }
      if (!bVar10) goto LAB_007cdcf5;
    }
    bucket_00 = 0xffffffff;
  }
LAB_007cdcf5:
  if (bucket_00 != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
                        ,0x10a,"(FindEntry(weakRef->FastGet()) == -1)",
                        "FindEntry(weakRef->FastGet()) == -1");
    if (!bVar10) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pRVar7 = Insert(this,weakRef,value,key,bucket);
  return pRVar7;
}

Assistant:

const RecyclerWeakReference<TKey>* UncheckedInsert(const RecyclerWeakReference<TKey>* weakRef, TValue value)
        {
            if (buckets == nullptr) Initialize(0);

            int hash = GetHashCode(weakRef->FastGet());
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            Assert(FindEntry(weakRef->FastGet()) == -1);
            return Insert(weakRef, value, hash, bucket);
        }